

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

int __thiscall ON_OBSOLETE_V5_DimLinear::Repair(ON_OBSOLETE_V5_DimLinear *this)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  ON_2dPoint *pOVar4;
  double dVar5;
  ON_2dVector OVar6;
  ON_2dPoint p;
  double local_70;
  ON_3dPoint local_68;
  int local_4c;
  double dStack_48;
  int i;
  double d;
  ON_2dVector v;
  int rc;
  int dim_pt_count;
  int userpositionedtext_pt_index;
  int arrow1_pt_index;
  int ext1_pt_index;
  int arrow0_pt_index;
  int ext0_pt_index;
  ON_OBSOLETE_V5_DimLinear *this_local;
  
  v.y._4_4_ = 0;
  iVar3 = ON_SimpleArray<ON_2dPoint>::Count
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>);
  if (iVar3 < 5) {
    return v.y._4_4_;
  }
  pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                     (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                       super_ON_SimpleArray<ON_2dPoint>,0);
  bVar2 = ON_2dPoint::IsValid(pOVar4);
  if (!bVar2) {
    return v.y._4_4_;
  }
  pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                     (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                       super_ON_SimpleArray<ON_2dPoint>,2);
  bVar2 = ON_2dPoint::IsValid(pOVar4);
  if (!bVar2) {
    return v.y._4_4_;
  }
  v.y._4_4_ = 1;
  bVar2 = ON_Plane::IsValid(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane);
  if (!bVar2) {
    v.y._4_4_ = ON_Plane_Repair(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane);
  }
  iVar3 = ON_SimpleArray<ON_2dPoint>::Count
                    (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                      super_ON_SimpleArray<ON_2dPoint>);
  if (5 < iVar3) {
    v.y._4_4_ = 2;
    ON_SimpleArray<ON_2dPoint>::SetCount
              (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>,5)
    ;
  }
  pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                     (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                       super_ON_SimpleArray<ON_2dPoint>,0);
  ON_2dVector::ON_2dVector((ON_2dVector *)&d,pOVar4);
  bVar2 = ON_2dVector::IsZero((ON_2dVector *)&d);
  if (!bVar2) {
    v.y._4_4_ = 2;
    ON_Plane::PointAt(&local_68,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,d,v.x);
    (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.x = local_68.x;
    (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.y = local_68.y;
    (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.z = local_68.z;
    ON_Plane::UpdateEquation(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane);
    OVar6 = ON_2dVector::operator-((ON_2dVector *)&d);
    p.y = OVar6.x;
    d = p.y;
    local_70 = OVar6.y;
    v.x = local_70;
    for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,local_4c);
      ON_2dPoint::operator+=(pOVar4,(ON_2dVector *)&d);
    }
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,0);
    ON_2dPoint::Set(pOVar4,0.0,0.0);
  }
  if ((this->super_ON_OBSOLETE_V5_Annotation).m_type == dtDimAligned) {
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,2);
    if (0.0 < pOVar4->x || pOVar4->x == 0.0) {
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,2);
      if ((pOVar4->y == 0.0) && (!NAN(pOVar4->y))) goto LAB_0066d865;
    }
    v.y._4_4_ = 2;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,2);
    if ((pOVar4->x <= 1.4901161193849998e-06) ||
       (pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                             super_ON_SimpleArray<ON_2dPoint>,2),
       1.490116119385e-08 < ABS(pOVar4->y))) {
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,2);
      ON_2dVector::operator=((ON_2dVector *)&d,pOVar4);
      dStack_48 = ON_2dVector::Length((ON_2dVector *)&d);
      ON_2dVector::Unitize((ON_2dVector *)&d);
      ON_Plane::Rotate(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,v.x,d,
                       &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis,
                       &(this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin);
      v.x = -v.x;
      for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
        pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                             super_ON_SimpleArray<ON_2dPoint>,local_4c);
        dVar1 = pOVar4->x;
        dVar5 = pOVar4->y;
        pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                             super_ON_SimpleArray<ON_2dPoint>,local_4c);
        ON_2dPoint::Set(pOVar4,d * dVar1 + -(v.x * dVar5),v.x * dVar1 + d * dVar5);
      }
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,0);
      ON_2dPoint::Set(pOVar4,0.0,0.0);
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,2);
      ON_2dPoint::Set(pOVar4,dStack_48,0.0);
    }
    else {
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,2);
      pOVar4->y = 0.0;
    }
  }
  else {
LAB_0066d865:
    if ((this->super_ON_OBSOLETE_V5_Annotation).m_type != dtDimLinear) {
      v.y._4_4_ = 2;
      (this->super_ON_OBSOLETE_V5_Annotation).m_type = dtDimLinear;
    }
  }
  pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                     (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                       super_ON_SimpleArray<ON_2dPoint>,1);
  dVar1 = pOVar4->x;
  pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                     (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                       super_ON_SimpleArray<ON_2dPoint>,0);
  if ((dVar1 != pOVar4->x) || (NAN(dVar1) || NAN(pOVar4->x))) {
    v.y._4_4_ = 2;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,0);
    dVar1 = pOVar4->x;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,1);
    pOVar4->x = dVar1;
  }
  pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                     (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                       super_ON_SimpleArray<ON_2dPoint>,3);
  dVar1 = pOVar4->x;
  pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                     (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                       super_ON_SimpleArray<ON_2dPoint>,2);
  if ((dVar1 != pOVar4->x) || (NAN(dVar1) || NAN(pOVar4->x))) {
    v.y._4_4_ = 2;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,2);
    dVar1 = pOVar4->x;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,3);
    pOVar4->x = dVar1;
  }
  pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                     (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                       super_ON_SimpleArray<ON_2dPoint>,1);
  bVar2 = ON_IsValid(pOVar4->y);
  if (bVar2) {
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,3);
    bVar2 = ON_IsValid(pOVar4->y);
    if (bVar2) {
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,1);
      dVar1 = pOVar4->y;
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,3);
      if ((dVar1 != pOVar4->y) || (NAN(dVar1) || NAN(pOVar4->y))) {
        v.y._4_4_ = 2;
        pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                             super_ON_SimpleArray<ON_2dPoint>,1);
        dVar1 = pOVar4->y;
        pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                             super_ON_SimpleArray<ON_2dPoint>,3);
        dVar5 = (dVar1 + pOVar4->y) * 0.5;
        dStack_48 = dVar5;
        pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                             super_ON_SimpleArray<ON_2dPoint>,1);
        dVar1 = dStack_48;
        pOVar4->y = dVar5;
        pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                             super_ON_SimpleArray<ON_2dPoint>,3);
        pOVar4->y = dVar1;
      }
    }
    else {
      v.y._4_4_ = 2;
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,1);
      dVar1 = pOVar4->y;
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,3);
      pOVar4->y = dVar1;
    }
  }
  else {
    v.y._4_4_ = 2;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,3);
    bVar2 = ON_IsValid(pOVar4->y);
    if (!bVar2) {
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,0);
      dVar1 = pOVar4->y;
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,2);
      dVar5 = pOVar4->y;
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,3);
      pOVar4->y = (dVar1 + dVar5) * 0.5;
    }
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,3);
    dVar1 = pOVar4->y;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,1);
    pOVar4->y = dVar1;
  }
  if (((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext & 1U) != 0) {
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,4);
    bVar2 = ON_2dPoint::IsValid(pOVar4);
    if (!bVar2) {
      v.y._4_4_ = 2;
      (this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext = false;
    }
  }
  if (((this->super_ON_OBSOLETE_V5_Annotation).m_userpositionedtext & 1U) == 0) {
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,4);
    dVar1 = pOVar4->y;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,1);
    if ((dVar1 == pOVar4->y) && (!NAN(dVar1) && !NAN(pOVar4->y))) {
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,4);
      dVar1 = pOVar4->x;
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,1);
      dVar5 = pOVar4->x;
      pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,3);
      dVar5 = (dVar5 + pOVar4->x) * 0.5;
      if ((dVar1 == dVar5) && (!NAN(dVar1) && !NAN(dVar5))) goto LAB_0066de93;
    }
    v.y._4_4_ = 2;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,1);
    dVar1 = pOVar4->y;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,4);
    pOVar4->y = dVar1;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,1);
    dVar1 = pOVar4->x;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,3);
    dVar5 = pOVar4->x;
    pOVar4 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,4);
    pOVar4->x = (dVar1 + dVar5) * 0.5;
  }
LAB_0066de93:
  bVar2 = ON_Plane::IsValid(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane);
  if (!bVar2) {
    v.y._4_4_ = 2;
    ON_Plane_Repair(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane);
  }
  return v.y._4_4_;
}

Assistant:

int ON_OBSOLETE_V5_DimLinear::Repair()
{
  // returns 0 = unable to repair
  //         1 = in perfect condition
  //         2 == repaired.

  const int ext0_pt_index   = ON_OBSOLETE_V5_DimLinear::ext0_pt_index;
  const int arrow0_pt_index = ON_OBSOLETE_V5_DimLinear::arrow0_pt_index;
  const int ext1_pt_index   = ON_OBSOLETE_V5_DimLinear::ext1_pt_index;
  const int arrow1_pt_index = ON_OBSOLETE_V5_DimLinear::arrow1_pt_index;
  const int userpositionedtext_pt_index = ON_OBSOLETE_V5_DimLinear::userpositionedtext_pt_index;
  const int dim_pt_count    = ON_OBSOLETE_V5_DimLinear::dim_pt_count;

  int rc = 0;
  if (    m_points.Count() >= dim_pt_count 
       && m_points[ext0_pt_index].IsValid() 
       && m_points[ext1_pt_index].IsValid() )
  {
    rc = 1;
    if ( !m_plane.IsValid() )
    {
      rc = ON_Plane_Repair(m_plane);
    }

    if ( m_points.Count() > dim_pt_count )
    {
      rc = 2;
      m_points.SetCount(dim_pt_count);
    }

    // m_points[ext0_pt_index] must be at (0,0)
    ON_2dVector v = m_points[ext0_pt_index];
    double d;
    int i;
    if ( !v.IsZero() )
    {
      rc = 2;
      m_plane.origin = m_plane.PointAt(v.x,v.y);
      m_plane.UpdateEquation();
      v = -v;
      for ( i = 0; i < dim_pt_count; i++ )
      {
        m_points[i] += v;
      }
      m_points[ext0_pt_index].Set(0.0,0.0);
    }

    if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimAligned == m_type && (m_points[ext1_pt_index].x < 0.0 || m_points[ext1_pt_index].y != 0.0) )
    {
      rc = 2;
      // Aligned dims must have m_points[ext1_pt_index].x = m_points[ext0_pt_index].x
      if (   m_points[ext1_pt_index].x > 100.0*ON_SQRT_EPSILON
          && fabs(m_points[ext1_pt_index].y) <= ON_SQRT_EPSILON )
      {
        m_points[ext1_pt_index].y = 0.0;
      }
      else
      {
        // Dimension line parallel to point0 -> point2
        // rotate the plane so p2 is on the x axis
        v = m_points[ext1_pt_index];
        d = v.Length();
        v.Unitize();
        m_plane.Rotate(v.y,v.x,m_plane.zaxis,m_plane.origin);

        // rotate points in opposite direction
        v.y = -v.y; 
        for ( i = 0; i < dim_pt_count; i++ )
        {
          ON_2dPoint p = m_points[i];
          m_points[i].Set( v.x*p.x - v.y*p.y, v.y*p.x + v.x*p.y );
        }
        m_points[ext0_pt_index].Set(0.0,0.0);
        m_points[ext1_pt_index].Set(d,0.0);
      }
    }
    else if ( ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear != m_type )
    {
      rc = 2;
      m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimLinear;
    }

    if ( m_points[arrow0_pt_index].x != m_points[ext0_pt_index].x )
    {
      rc = 2;
      m_points[arrow0_pt_index].x = m_points[ext0_pt_index].x;
    }

    if ( m_points[arrow1_pt_index].x != m_points[ext1_pt_index].x )
    {
      rc = 2;
      m_points[arrow1_pt_index].x = m_points[ext1_pt_index].x;
    }

    if ( !ON_IsValid(m_points[arrow0_pt_index].y) )
    {
      rc = 2;
      if ( !ON_IsValid(m_points[arrow1_pt_index].y) )
        m_points[arrow1_pt_index].y = 0.5*(m_points[ext0_pt_index].y + m_points[ext1_pt_index].y);
      m_points[arrow0_pt_index].y = m_points[arrow1_pt_index].y;
    }
    else if ( !ON_IsValid(m_points[arrow1_pt_index].y) )
    {
      rc = 2;
      m_points[arrow1_pt_index].y = m_points[arrow0_pt_index].y;
    }
    else if ( m_points[arrow0_pt_index].y != m_points[arrow1_pt_index].y )
    {
      rc = 2;
      d = 0.5*(m_points[arrow0_pt_index].y + m_points[arrow1_pt_index].y);
      m_points[arrow0_pt_index].y = d;
      m_points[arrow1_pt_index].y = d;
    }

    if ( m_userpositionedtext )
    {
      if ( !m_points[userpositionedtext_pt_index].IsValid() )
      {
        rc = 2;
        m_userpositionedtext = false;
      }
    }
    
    if ( !m_userpositionedtext )
    {
      if (    m_points[userpositionedtext_pt_index].y != m_points[arrow0_pt_index].y
           || m_points[userpositionedtext_pt_index].x != 0.5*(m_points[arrow0_pt_index].x + m_points[arrow1_pt_index].x) )
      {
        rc = 2;
        m_points[userpositionedtext_pt_index].y = m_points[arrow0_pt_index].y;
        m_points[userpositionedtext_pt_index].x = 0.5*(m_points[arrow0_pt_index].x + m_points[arrow1_pt_index].x);
      }
    }

    if ( !m_plane.IsValid() )
    {
      rc = 2;
      ON_Plane_Repair(m_plane);
    }
  }
  return rc;
}